

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::CompactRange(DBImpl *this,Slice *begin,Slice *end)

{
  Version *this_00;
  bool bVar1;
  int iVar2;
  int level;
  int iVar3;
  DB local_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    this_00 = this->versions_->current_;
    iVar3 = 1;
    iVar2 = 1;
    do {
      bVar1 = Version::OverlapInLevel(this_00,iVar3,begin,end);
      if (bVar1) {
        iVar2 = iVar3;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 7);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffc8);
    if (local_38._vptr_DB != (_func_int **)0x0) {
      operator_delete__(local_38._vptr_DB);
    }
    if (0 < iVar2) {
      iVar3 = 0;
      do {
        TEST_CompactRange(this,iVar3,begin,end);
        iVar3 = iVar3 + 1;
      } while (iVar2 != iVar3);
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void DBImpl::CompactRange(const Slice* begin, const Slice* end) {
  int max_level_with_files = 1;
  {
    MutexLock l(&mutex_);
    Version* base = versions_->current();
    for (int level = 1; level < config::kNumLevels; level++) {
      if (base->OverlapInLevel(level, begin, end)) {
        max_level_with_files = level;
      }
    }
  }
  TEST_CompactMemTable();  // TODO(sanjay): Skip if memtable does not overlap
  for (int level = 0; level < max_level_with_files; level++) {
    TEST_CompactRange(level, begin, end);
  }
}